

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::SocketTest_MockSocketHello_Test::SocketTest_MockSocketHello_Test
          (SocketTest_MockSocketHello_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00255ee8;
  return;
}

Assistant:

TEST(SocketTest, MockSocketHello)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};
    const ByteArray kWorld{'w', 'o', 'r', 'l', 'd'};

    auto eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    auto clientSocket = std::make_shared<MockSocket>(eventBase, Address::FromString(kClientAddr), kClientPort);
    auto serverSocket = std::make_shared<MockSocket>(eventBase, Address::FromString(kServerAddr), kServerPort);

    clientSocket->Connect(serverSocket);
    serverSocket->Connect(clientSocket);

    EXPECT_TRUE(clientSocket->IsConnected());
    EXPECT_TRUE(serverSocket->IsConnected());

    EXPECT_EQ(clientSocket->GetPeerAddr(), serverSocket->GetLocalAddr());
    EXPECT_EQ(clientSocket->GetPeerPort(), serverSocket->GetLocalPort());
    EXPECT_EQ(clientSocket->GetLocalAddr(), serverSocket->GetPeerAddr());
    EXPECT_EQ(clientSocket->GetLocalPort(), serverSocket->GetPeerPort());

    serverSocket->SetEventHandler([&](short aFlags) {
        if (aFlags & EV_READ)
        {
            uint8_t buf[1024];
            int     len = serverSocket->Receive(buf, sizeof(buf));
            EXPECT_EQ(static_cast<size_t>(len), kHello.size());

            len = serverSocket->Send(&kWorld[0], kWorld.size());
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());
        }
    });
    clientSocket->SetEventHandler([&](short aFlags) {
        if (aFlags & EV_READ)
        {
            uint8_t buf[1024];
            int     len = clientSocket->Receive(buf, sizeof(buf));
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());

            event_base_loopbreak(eventBase);
        }
    });

    int len = clientSocket->Send(&kHello[0], kHello.size());
    EXPECT_EQ(static_cast<size_t>(len), kHello.size());

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}